

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  char *pcVar1;
  uint *pk_parity;
  char cVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  uchar *puVar5;
  byte bVar6;
  int iVar7;
  int extraout_EAX;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  ulong uVar11;
  FILE *__stream;
  size_t sVar12;
  secp256k1_ge *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_context *psVar15;
  void *pvVar16;
  void *pvVar17;
  ulong extraout_RAX;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  secp256k1_fe *psVar21;
  void *pvVar22;
  ulong uVar23;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  bool bVar24;
  uint uVar25;
  char *pcVar26;
  long lVar27;
  FILE *pFVar28;
  uint64_t uVar29;
  uint uVar30;
  undefined1 *puVar31;
  ulong uVar32;
  secp256k1_gej *psVar33;
  _func_void_char_ptr_void_ptr *p_Var34;
  secp256k1_fe *psVar35;
  uint64_t *puVar36;
  secp256k1_gej *psVar37;
  ulong uVar38;
  secp256k1_context *psVar39;
  secp256k1_ge *psVar40;
  ulong uVar41;
  code *na;
  uint64_t uVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  long lVar46;
  secp256k1_scalar *psVar47;
  uint uVar48;
  secp256k1_context *psVar49;
  undefined1 *puVar50;
  undefined1 *puVar51;
  secp256k1_scalar *r_00;
  secp256k1_keypair *keypair;
  uchar *puVar52;
  secp256k1_context *a;
  secp256k1_xonly_pubkey *psVar53;
  bool bVar54;
  byte bVar55;
  undefined1 auVar56 [16];
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  secp256k1_gej *psStack_1cb0;
  secp256k1_gej *psStack_1ca8;
  secp256k1_scalar *psStack_1c98;
  ulong uStack_1c90;
  secp256k1_scalar *psStack_1c88;
  int iStack_1c7c;
  secp256k1_gej *psStack_1c78;
  uint64_t uStack_1c70;
  undefined1 auStack_1c68 [16];
  undefined1 auStack_1c58 [16];
  undefined1 auStack_1c48 [16];
  int iStack_1c38;
  undefined1 auStack_1c28 [16];
  undefined1 auStack_1c18 [16];
  int iStack_1bfc;
  undefined1 auStack_1bf8 [48];
  _func_void_char_ptr_void_ptr *p_Stack_1bc8;
  secp256k1_scalar *psStack_1bc0;
  _func_void_char_ptr_void_ptr *p_Stack_1bb8;
  secp256k1_context *psStack_1bb0;
  uint uStack_1ba4;
  ulong uStack_1ba0;
  secp256k1_context *psStack_1b98;
  uint64_t uStack_1b90;
  secp256k1_callback sStack_1b88;
  secp256k1_callback sStack_1b78;
  uint64_t uStack_1b68;
  secp256k1_scalar *psStack_1b60;
  _func_void_char_ptr_void_ptr *p_Stack_1b58;
  secp256k1_gej *psStack_1b50;
  _func_void_char_ptr_void_ptr *p_Stack_1b48;
  undefined1 *puStack_1b40;
  secp256k1_gej *psStack_1b38;
  secp256k1_schnorrsig_extraparams sStack_1b30;
  undefined1 auStack_1b18 [16];
  undefined1 auStack_1b08 [16];
  undefined1 auStack_1af8 [16];
  undefined1 auStack_1ae8 [16];
  undefined1 auStack_19b8 [32];
  uchar auStack_1998 [32];
  undefined1 auStack_1978 [56];
  uchar auStack_1940 [8];
  undefined1 auStack_1938 [16];
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  int iStack_1920;
  int iStack_191c;
  int iStack_1918;
  uchar auStack_1698 [32];
  undefined1 auStack_1678 [16];
  undefined1 auStack_1668 [16];
  uchar auStack_1658 [4];
  uchar auStack_1654 [4];
  int iStack_1650;
  int iStack_164c;
  undefined1 auStack_13d8 [96];
  secp256k1_context asStack_1378 [5];
  undefined1 auStack_ef8 [32];
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  int iStack_ed0;
  int iStack_ecc;
  ulong uStack_ec8;
  uint64_t auStack_ec0 [2];
  uint64_t uStack_eb0;
  uchar auStack_ea8 [4];
  uchar auStack_ea4 [4];
  int aiStack_ea0 [4];
  secp256k1_context asStack_e90 [5];
  secp256k1_ge sStack_a18;
  undefined1 auStack_9b0 [8];
  undefined1 auStack_9a8 [152];
  secp256k1_context asStack_910 [9];
  secp256k1_gej *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  code *pcStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [24];
  uint64_t uStack_180;
  uint64_t local_178;
  int local_170;
  int local_16c;
  secp256k1_fe local_168;
  undefined1 local_138 [24];
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  int local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  secp256k1_ge local_98;
  
  bVar55 = 0;
  psVar14 = (secp256k1_gej *)local_198;
  pcStack_1b0 = (code *)0x11193e;
  secp256k1_fe_sqr((secp256k1_fe *)psVar14,n);
  pcStack_1b0 = (code *)0x11194c;
  secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    pcStack_1b0 = (code *)0x111b04;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 2;
    local_170 = local_170 + 1;
    local_16c = 0;
    pcStack_1b0 = (code *)0x111b1a;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      psVar13 = (secp256k1_ge *)local_198;
LAB_00111b23:
      pcStack_1b0 = (code *)0x111b28;
      iVar7 = secp256k1_fe_is_square_var(&psVar13->x);
      if (iVar7 == 0) {
        return 0;
      }
    }
LAB_00111b30:
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x111b48;
    secp256k1_fe_mul(&local_98.x,r,n);
    n = &local_98.y;
    pcStack_1b0 = (code *)0x111b5b;
    secp256k1_fe_sqr(n,r);
    local_98.infinity = 0;
    psVar37 = (secp256k1_gej *)(ulong)*q;
    pcStack_1b0 = (code *)0x111b6c;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar37);
    if (*q == 0) {
      pcStack_1b0 = (code *)0x111c1b;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)local_138;
      pcStack_1b0 = (code *)0x111b8e;
      secp256k1_ecmult_const((secp256k1_gej *)r,&local_98,q);
      pcStack_1b0 = (code *)0x111b96;
      psVar37 = (secp256k1_gej *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        pcStack_1b0 = (code *)0x111bb4;
        secp256k1_fe_sqr(&local_168,&local_d8);
        pcStack_1b0 = (code *)0x111bc4;
        secp256k1_fe_mul(&local_168,&local_168,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          pcStack_1b0 = (code *)0x111bd9;
          secp256k1_fe_mul(&local_168,&local_168,d);
        }
        pcStack_1b0 = (code *)0x111be9;
        secp256k1_fe_inv(&local_168,&local_168);
        pcStack_1b0 = (code *)0x111bfb;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)local_138,&local_168);
        return 1;
      }
    }
    pcStack_1b0 = (code *)0x111c20;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00111c20:
    pcStack_1b0 = (code *)0x111c25;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    pcStack_1b0 = (code *)0x111962;
    secp256k1_fe_verify(d);
    uVar11 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar23 = (uVar11 >> 0x34) + d->n[1];
    uVar32 = (uVar23 >> 0x34) + d->n[2];
    psVar37 = (secp256k1_gej *)((uVar32 >> 0x34) + d->n[3]);
    uVar41 = ((ulong)psVar37 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar23 | uVar11 | uVar32 | (ulong)psVar37) & 0xfffffffffffff) == 0 && uVar41 == 0) ||
       (((uVar11 ^ 0x1000003d0) & uVar23 & uVar32 & (ulong)psVar37 & (uVar41 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00111c20;
    psVar14 = (secp256k1_gej *)local_138;
    pcStack_1b0 = (code *)0x111a0e;
    secp256k1_fe_sqr((secp256k1_fe *)psVar14,d);
    pcStack_1b0 = (code *)0x111a16;
    psVar37 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    if (local_110 < 0x11) {
      psVar14 = (secp256k1_gej *)local_138;
      local_138._0_8_ = local_138._0_8_ * 2;
      local_138._8_8_ = local_138._8_8_ * 2;
      uStack_120 = uStack_120 * 2;
      local_138._16_8_ = local_138._16_8_ * 2;
      local_118 = local_118 << 1;
      local_110 = local_110 * 2;
      local_10c = 0;
      pcStack_1b0 = (code *)0x111a62;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      pcStack_1b0 = (code *)0x111a70;
      secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,d);
      r = (secp256k1_fe *)local_198;
      pcStack_1b0 = (code *)0x111a7d;
      secp256k1_fe_verify(r);
      pcStack_1b0 = (code *)0x111a85;
      psVar37 = psVar14;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      if (0x20 < local_110 + local_170) goto LAB_00111c2a;
      local_198._0_8_ = local_198._0_8_ + local_138._0_8_;
      local_198._8_8_ = local_198._8_8_ + local_138._8_8_;
      local_198._16_8_ = local_198._16_8_ + local_138._16_8_;
      uStack_180 = uStack_180 + uStack_120;
      local_178 = local_178 + local_118;
      local_16c = 0;
      pcStack_1b0 = (code *)0x111ad6;
      local_170 = local_110 + local_170;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        psVar13 = &local_98;
        pcStack_1b0 = (code *)0x111af2;
        secp256k1_fe_mul(&psVar13->x,(secp256k1_fe *)local_198,d);
        goto LAB_00111b23;
      }
      goto LAB_00111b30;
    }
  }
  pcStack_1b0 = (code *)0x111c2a;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_00111c2a:
  pcStack_1b0 = secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_1c8 = (code *)0x111c50;
  psStack_1c0 = (secp256k1_gej *)r;
  psStack_1b8 = d;
  pcStack_1b0 = (code *)q;
  secp256k1_fe_verify(&psVar37->x);
  uVar11 = (psVar37->x).n[4];
  uVar23 = (uVar11 >> 0x30) * 0x1000003d1 + (psVar37->x).n[0];
  uVar41 = (uVar23 >> 0x34) + (psVar37->x).n[1];
  uVar32 = (uVar41 >> 0x34) + (psVar37->x).n[2];
  uVar38 = uVar32 & 0xfffffffffffff;
  uVar32 = (uVar32 >> 0x34) + (psVar37->x).n[3];
  uVar11 = (uVar32 >> 0x34) + (uVar11 & 0xffffffffffff);
  uVar23 = uVar23 & 0xfffffffffffff;
  uVar43 = (ulong)(0xffffefffffc2e < uVar23 &&
                  ((uVar38 & uVar41 & uVar32) == 0xfffffffffffff && uVar11 == 0xffffffffffff)) |
           uVar11 >> 0x30;
  uVar23 = uVar43 * 0x1000003d1 + uVar23;
  uVar41 = (uVar23 >> 0x34) + (uVar41 & 0xfffffffffffff);
  psVar33 = (secp256k1_gej *)((uVar41 >> 0x34) + uVar38);
  uVar32 = ((ulong)psVar33 >> 0x34) + (uVar32 & 0xfffffffffffff);
  uVar11 = (uVar32 >> 0x34) + uVar11;
  if ((uint)(ushort)(uVar11 >> 0x30) == (uint)uVar43) {
    (psVar37->x).n[0] = uVar23 & 0xfffffffffffff;
    (psVar37->x).n[1] = uVar41 & 0xfffffffffffff;
    (psVar37->x).n[2] = (ulong)psVar33 & 0xfffffffffffff;
    (psVar37->x).n[3] = uVar32 & 0xfffffffffffff;
    (psVar37->x).n[4] = uVar11 & 0xffffffffffff;
    (psVar37->x).magnitude = 1;
    (psVar37->x).normalized = 1;
    secp256k1_fe_verify(&psVar37->x);
    return extraout_EAX;
  }
  pcStack_1c8 = main;
  secp256k1_fe_normalize_cold_1();
  uStack_1d0 = 0xfffffffffffff;
  uStack_1d8 = 0xffffffffffff;
  psStack_1f0 = psVar37;
  psStack_1e8 = n;
  psStack_1e0 = psVar14;
  pcStack_1c8 = (code *)(ulong)(uint)known_on_curve;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  iVar7 = (int)uVar32;
  psStack_1cb0 = (secp256k1_gej *)(uVar32 & 0xffffffff);
  psStack_1c78 = psVar33;
  if (iVar7 < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar11 = strtol((char *)(psVar33->x).n[1],(char **)0x0,0);
    count = (int)uVar11;
    printf("test count = %i\n",uVar11 & 0xffffffff);
    if (iVar7 != 2) {
      pcVar26 = (char *)(psVar33->x).n[2];
      asStack_1378[0].ecmult_gen_ctx.built = 0;
      asStack_1378[0].ecmult_gen_ctx.scalar_offset = 0;
      asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
      if ((pcVar26 != (char *)0x0) && (*pcVar26 != '\0')) {
        lVar46 = 0;
        do {
          psStack_1cb0._0_4_ = iVar7;
          if (pcVar26[1] == '\0') goto LAB_00111ec3;
          iVar8 = __isoc99_sscanf(pcVar26,"%2hx",auStack_9a8);
          if (iVar8 != 1) goto LAB_00111ec3;
          auStack_13d8[lVar46 + 0x60] = auStack_9a8[0];
          if (lVar46 == 0xf) goto LAB_00111ec3;
          lVar46 = lVar46 + 1;
          pcVar1 = pcVar26 + 2;
          pcVar26 = pcVar26 + 2;
          if (*pcVar1 == '\0') goto LAB_00111ec3;
        } while( true );
      }
    }
  }
  asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  asStack_1378[0].ecmult_gen_ctx.built = 0;
  asStack_1378[0].ecmult_gen_ctx.scalar_offset = 0;
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) &&
     (sVar12 = fread(auStack_13d8 + 0x60,1,0x10,__stream), sVar12 == 0x10)) goto LAB_00111ebb;
LAB_00114a9d:
  main_cold_1();
  iVar7 = (int)psStack_1cb0;
  if ((extraout_RAX & 1) == 0) {
LAB_00111ebb:
    psStack_1cb0._0_4_ = iVar7;
    fclose(__stream);
  }
LAB_00111ec3:
  na = (code *)((ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  lVar46 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1378[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_9a8._0_8_ = 0xbb67ae856a09e667;
  auStack_9a8._8_8_ = 0xa54ff53a3c6ef372;
  auStack_9a8._16_8_ = 0x9b05688c510e527f;
  auStack_9a8._24_8_ = 0x5be0cd191f83d9ab;
  auStack_9a8._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9a8,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9a8,auStack_13d8 + 0x60,0x10);
  puVar52 = auStack_ef8;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_9a8,puVar52);
  psVar14 = psStack_1c78;
  do {
    psVar21 = (secp256k1_fe *)0x0;
    uVar11 = 0;
    do {
      uVar11 = (ulong)puVar52[(long)psVar21] | uVar11 << 8;
      psVar21 = (secp256k1_fe *)((long)psVar21->n + 1);
    } while (psVar21 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar46] = uVar11;
    lVar46 = lVar46 + 1;
    puVar52 = puVar52 + 8;
  } while (lVar46 != 4);
  if (4 < (int)psStack_1cb0) {
    lVar46 = strtol((char *)(psStack_1c78->x).n[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar46;
    uVar11 = strtol((char *)(psVar14->x).n[4],(char **)0x0,0);
    this_core = (uint32_t)uVar11;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114ac5:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar11 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar39 = (secp256k1_context *)0xd0;
  psVar13 = (secp256k1_ge *)malloc(0xd0);
  if (psVar13 == (secp256k1_ge *)0x0) goto LAB_00114b4f;
  psVar39 = (secp256k1_context *)0x130;
  psVar14 = (secp256k1_gej *)malloc(0x130);
  if (psVar14 != (secp256k1_gej *)0x0) {
    psVar39 = (secp256k1_context *)0x130;
    psStack_1cb0 = (secp256k1_gej *)malloc(0x130);
    if (psStack_1cb0 == (secp256k1_gej *)0x0) goto LAB_00114b59;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9a8);
    uVar25 = 0xff;
    do {
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
      if ((uVar25 < 0x20) && ((7U >> (uVar25 & 0x1f) & 1) != 0)) {
        psVar21 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,&secp256k1_ge_const_g,
                   (secp256k1_fe *)0x0);
      }
      bVar54 = uVar25 != 0;
      uVar25 = uVar25 - 1;
    } while (bVar54);
    psVar39 = (secp256k1_context *)auStack_ef8;
    secp256k1_gej_double_var
              ((secp256k1_gej *)psVar39,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
    iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar39,&secp256k1_ge_const_g);
    if (iVar7 == 0) {
LAB_00114b22:
      main_cold_71();
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_ef8);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_ef8,(secp256k1_gej *)auStack_ef8,
                 (secp256k1_gej *)auStack_9a8,psVar21);
      lVar27 = 0;
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
      memcpy(psVar14,(secp256k1_gej *)auStack_9a8,0x98);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_ef8,(secp256k1_gej *)auStack_ef8,
                 (secp256k1_gej *)auStack_9a8,psVar21);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
      memcpy(psVar14 + 1,(secp256k1_gej *)auStack_9a8,0x98);
      secp256k1_gej_neg(psStack_1cb0,(secp256k1_gej *)auStack_ef8);
      secp256k1_gej_add_var(psStack_1cb0 + 1,psStack_1cb0,psVar14,psVar21);
      secp256k1_gej_verify(psStack_1cb0);
      secp256k1_gej_verify(psStack_1cb0 + 1);
      lVar46 = -1;
      bVar54 = true;
      do {
        bVar24 = bVar54;
        if (psStack_1cb0[lVar27].infinity == 0) {
          psVar40 = psVar13 + lVar27;
          if (lVar46 == -1) {
            uVar42 = psStack_1cb0[lVar27].z.n[0];
            uVar29 = psStack_1cb0[lVar27].z.n[1];
            auVar56 = *(undefined1 (*) [16])(psStack_1cb0[lVar27].z.n + 2);
            uVar18 = *(undefined4 *)((long)psStack_1cb0[lVar27].z.n + 0x24);
            iVar7 = psStack_1cb0[lVar27].z.magnitude;
            iVar8 = psStack_1cb0[lVar27].z.normalized;
            *(int *)((psVar40->x).n + 4) = (int)psStack_1cb0[lVar27].z.n[4];
            *(undefined4 *)((long)(psVar40->x).n + 0x24) = uVar18;
            (psVar40->x).magnitude = iVar7;
            (psVar40->x).normalized = iVar8;
            *(undefined1 (*) [16])((psVar40->x).n + 2) = auVar56;
            (psVar40->x).n[0] = uVar42;
            (psVar40->x).n[1] = uVar29;
            lVar46 = lVar27;
          }
          else {
            secp256k1_fe_mul(&psVar40->x,&psVar13[lVar46].x,&psStack_1cb0[lVar27].z);
            lVar46 = lVar27;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar13 + lVar27);
        }
        lVar27 = 1;
        bVar54 = false;
      } while (bVar24);
      if (lVar46 == -1) goto LAB_00112349;
      psVar39 = (secp256k1_context *)auStack_ef8;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar39,&psVar13[lVar46].x);
      if (lVar46 == 0) {
LAB_001122b8:
        lVar46 = 0;
      }
      else if (psStack_1cb0->infinity == 0) {
        psVar39 = (secp256k1_context *)auStack_ef8;
        secp256k1_fe_mul(&psVar13[lVar46].x,(secp256k1_fe *)psVar13,(secp256k1_fe *)psVar39);
        secp256k1_fe_mul((secp256k1_fe *)psVar39,(secp256k1_fe *)psVar39,&psStack_1cb0[lVar46].z);
        goto LAB_001122b8;
      }
      if (psStack_1cb0[lVar46].infinity == 0) {
        puVar36 = psVar13[lVar46].x.n + 4;
        *(undefined4 *)puVar36 = uStack_ed8;
        *(undefined4 *)((long)puVar36 + 4) = uStack_ed4;
        *(int *)(puVar36 + 1) = iStack_ed0;
        *(int *)((long)puVar36 + 0xc) = iStack_ecc;
        *(undefined1 (*) [16])(psVar13[lVar46].x.n + 2) = auStack_ef8._16_16_;
        psVar13[lVar46].x.n[0] = auStack_ef8._0_8_;
        psVar13[lVar46].x.n[1] = auStack_ef8._8_8_;
        lVar46 = 0;
        bVar54 = true;
        do {
          bVar24 = bVar54;
          if (psStack_1cb0[lVar46].infinity == 0) {
            secp256k1_ge_set_gej_zinv(psVar13 + lVar46,psStack_1cb0 + lVar46,&psVar13[lVar46].x);
          }
          lVar46 = 1;
          bVar54 = false;
        } while (bVar24);
        secp256k1_ge_verify(psVar13);
        secp256k1_ge_verify(psVar13 + 1);
LAB_00112349:
        lVar46 = 0;
        bVar54 = true;
LAB_0011235a:
        psVar15 = (secp256k1_context *)(psVar13 + lVar46);
        psVar39 = psVar15;
        secp256k1_ge_verify((secp256k1_ge *)psVar15);
        if (psVar13[lVar46].infinity == 0) goto code_r0x00112376;
        main_cold_4();
LAB_00114adc:
        main_cold_53();
LAB_00114ae1:
        main_cold_5();
LAB_00114ae6:
        main_cold_6();
LAB_00114aeb:
        main_cold_69();
LAB_00114af0:
        main_cold_68();
LAB_00114af5:
        main_cold_67();
LAB_00114afa:
        main_cold_7();
LAB_00114aff:
        main_cold_8();
LAB_00114b04:
        main_cold_61();
LAB_00114b09:
        main_cold_60();
LAB_00114b0e:
        main_cold_59();
LAB_00114b13:
        main_cold_58();
LAB_00114b18:
        main_cold_50();
LAB_00114b1d:
        main_cold_56();
        goto LAB_00114b22;
      }
    }
    main_cold_3();
LAB_00114b2c:
    main_cold_55();
LAB_00114b31:
    main_cold_54();
LAB_00114b36:
    main_cold_52();
LAB_00114b3b:
    main_cold_51();
    goto LAB_00114b40;
  }
  goto LAB_00114b54;
code_r0x00112376:
  secp256k1_ge_to_storage(secp256k1_ecmult_gen_prec_table[0] + lVar46,(secp256k1_ge *)psVar15);
  lVar46 = 1;
  bVar24 = !bVar54;
  bVar54 = false;
  if (bVar24) goto code_r0x00112398;
  goto LAB_0011235a;
LAB_00114a80:
  main_cold_64();
LAB_00114a85:
  main_cold_63();
LAB_00114a8a:
  main_cold_62();
  goto LAB_00114a9d;
code_r0x00112398:
  free(psStack_1cb0);
  free(psVar14);
  free(psVar13);
  secp256k1_gej_set_ge((secp256k1_gej *)auStack_9a8,&secp256k1_ge_const_g);
  secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_9a8,gen);
  iVar7 = 0x80;
  do {
    secp256k1_gej_double_var
              ((secp256k1_gej *)auStack_9a8,(secp256k1_gej *)auStack_9a8,(secp256k1_fe *)0x0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_9a8,gen_00);
  iVar7 = count;
  while( true ) {
    count = iVar7 + -1;
    if (iVar7 == 0) {
      testrand256(auStack_13d8 + 0x60);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             asStack_1378[0].ecmult_gen_ctx._0_8_ & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
             (ulong)asStack_1378[0].ecmult_gen_ctx._0_8_ >> 0x38,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
             asStack_1378[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
      puts("no problems found");
      return 0;
    }
    psVar14 = (secp256k1_gej *)(auStack_13d8 + 0x60);
    psVar15 = secp256k1_context_create(1);
    testrand256(auStack_1998);
    psVar39 = psVar15;
    iVar7 = secp256k1_context_randomize(psVar15,auStack_1998);
    if (iVar7 == 0) break;
    psStack_1bb0 = psVar15;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9a8);
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_ef8,(secp256k1_gej *)auStack_9a8);
    lVar46 = -0x4e0;
    uVar25 = 1;
    psVar37 = (secp256k1_gej *)auStack_9a8;
    do {
      psVar33 = psVar37 + 1;
      secp256k1_gej_add_ge(psVar33,psVar37,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_9b0 + lVar46),psVar33);
      if (count != 0) {
        testutil_random_fe((secp256k1_fe *)psVar14);
        secp256k1_gej_rescale(psVar33,(secp256k1_fe *)psVar14);
      }
      auStack_1678._0_4_ = uVar25;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
      secp256k1_ecmult_gen(&psVar15->ecmult_gen_ctx,psVar14,(secp256k1_scalar *)auStack_1678);
      psVar39 = (secp256k1_context *)auStack_1978;
      secp256k1_ge_set_gej((secp256k1_ge *)psVar39,psVar14);
      if (*(int *)(auStack_9a8 + lVar46 + 0x58) != 0) goto LAB_00114ae1;
      if (iStack_1918 != 0) goto LAB_00114ae6;
      psVar39 = (secp256k1_context *)auStack_1978;
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar39,(secp256k1_fe *)(auStack_9b0 + lVar46));
      if (iVar7 == 0) goto LAB_00114aeb;
      psVar39 = (secp256k1_context *)(auStack_1978 + 0x30);
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar39,
                                 (secp256k1_fe *)(auStack_9a8 + lVar46 + 0x28));
      if (iVar7 == 0) goto LAB_00114af0;
      uVar25 = uVar25 + 1;
      lVar46 = lVar46 + 0x68;
      psVar37 = psVar33;
    } while (lVar46 != 0);
    uVar11 = 0;
    puVar50 = auStack_ef8;
    lVar46 = 0;
    do {
      psVar39 = (secp256k1_context *)(puVar50 + (uVar11 / 0xd) * -0x548);
      secp256k1_ge_mul_lambda((secp256k1_ge *)psVar14,(secp256k1_ge *)(auStack_ef8 + lVar46));
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar39,(secp256k1_ge *)psVar14);
      if (iVar7 == 0) goto LAB_00114af5;
      lVar46 = lVar46 + 0x68;
      puVar50 = puVar50 + 0x3a8;
      uVar11 = uVar11 + 9;
    } while (lVar46 != 0x548);
    psVar39 = (secp256k1_context *)auStack_ef8;
    secp256k1_ge_verify((secp256k1_ge *)psVar39);
    if (aiStack_ea0[2] == 0) goto LAB_00114b45;
    psVar39 = (secp256k1_context *)auStack_9a8;
    secp256k1_gej_verify((secp256k1_gej *)psVar39);
    if (auStack_9a8._144_4_ == 0) goto LAB_00114b4a;
    lVar46 = 0xc;
    psVar49 = asStack_e90;
    a = (secp256k1_context *)(auStack_9a8 + 0x98);
    do {
      psVar39 = psVar49;
      secp256k1_ge_verify((secp256k1_ge *)psVar49);
      if ((psVar49->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114afa;
      psVar39 = a;
      secp256k1_gej_verify((secp256k1_gej *)a);
      if ((int)(a->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114aff;
      a = (secp256k1_context *)&(a->ecmult_gen_ctx).proj_blind.magnitude;
      psVar49 = (secp256k1_context *)&(psVar49->ecmult_gen_ctx).ge_offset.infinity;
      lVar46 = lVar46 + -1;
    } while (lVar46 != 0);
    pFVar28 = (FILE *)auStack_ef8;
    psStack_1ca8 = (secp256k1_gej *)0x0;
    uStack_1c90 = 0;
    do {
      if (((ulong)num_cores == 1) ||
         (uStack_1c90 = uStack_1c90 + 0xe7037ed1a0b428db,
         (uint32_t)((uStack_1c90 >> 0x20 ^ uStack_1c90 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
         this_core)) {
        lVar46 = (long)psStack_1ca8 * 0x98;
        secp256k1_fe_inv((secp256k1_fe *)auStack_1678,
                         (secp256k1_fe *)(auStack_9a8 + (long)psStack_1ca8 * 0x98 + 0x60));
        lVar27 = 0;
        __stream = pFVar28;
        psVar14 = psStack_1ca8;
        do {
          psVar13 = (secp256k1_ge *)(((ulong)psVar14 / 0xd) * -0x548 + (long)__stream);
          psVar37 = (secp256k1_gej *)(auStack_9a8 + lVar27);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)(auStack_13d8 + 0x60),psVar37,
                     (secp256k1_gej *)(auStack_9a8 + (long)psStack_1ca8 * 0x98),
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_13d8 + 0x60),psVar13);
          if (iVar7 == 0) goto LAB_00114a80;
          if (psStack_1ca8 != (secp256k1_gej *)0x0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)(auStack_13d8 + 0x60),psVar37,
                       (secp256k1_ge *)(auStack_ef8 + (long)psStack_1ca8 * 0x68));
            iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_13d8 + 0x60),psVar13);
            if (iVar7 == 0) {
              main_cold_9();
              goto LAB_00114ac5;
            }
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)(auStack_13d8 + 0x60),psVar37,
                     (secp256k1_ge *)(auStack_ef8 + (long)psStack_1ca8 * 0x68),(secp256k1_fe *)0x0);
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_13d8 + 0x60),psVar13);
          psStack_1cb0 = psVar14;
          if (iVar7 == 0) goto LAB_00114a85;
          iStack_1918 = *(int *)(auStack_9a8 + (long)psStack_1ca8 * 0x98 + 0x90);
          auStack_1978._32_8_ = *(uint64_t *)(auStack_9a8 + lVar46 + 0x20);
          auStack_1978._40_7_ = (undefined7)*(undefined8 *)(auStack_9a8 + lVar46 + 0x28);
          auStack_1978[0x2f] = (uchar)((ulong)*(undefined8 *)(auStack_9a8 + lVar46 + 0x28) >> 0x38);
          auStack_1978._16_8_ = *(uint64_t *)(auStack_9a8 + (long)psStack_1ca8 * 0x98 + 0x10);
          auStack_1978._24_7_ = (undefined7)*(undefined8 *)(auStack_9a8 + lVar46 + 0x18);
          auStack_1978[0x1f] = (uchar)((ulong)*(undefined8 *)(auStack_9a8 + lVar46 + 0x18) >> 0x38);
          auStack_1978._0_8_ =
               (((secp256k1_gej *)(auStack_9a8 + (long)psStack_1ca8 * 0x98))->x).n[0];
          auStack_1978._8_7_ =
               (undefined7)*(undefined8 *)(auStack_9a8 + (long)psStack_1ca8 * 0x98 + 8);
          auStack_1978[0xf] =
               (uchar)((ulong)*(undefined8 *)(auStack_9a8 + (long)psStack_1ca8 * 0x98 + 8) >> 0x38);
          auStack_1978._48_8_ = *(undefined8 *)(auStack_9a8 + lVar46 + 0x30);
          auStack_1938 = *(undefined1 (*) [16])(auStack_9a8 + lVar46 + 0x40);
          uStack_1928 = *(undefined4 *)(auStack_9a8 + lVar46 + 0x50);
          uStack_1924 = *(undefined4 *)(auStack_9a8 + lVar46 + 0x54);
          iStack_1920 = *(int *)(auStack_9a8 + lVar46 + 0x58);
          iStack_191c = *(int *)(auStack_9a8 + lVar46 + 0x5c);
          auStack_1940._0_7_ = (undefined7)*(undefined8 *)(auStack_9a8 + lVar46 + 0x38);
          auStack_1940[7] = (uchar)((ulong)*(undefined8 *)(auStack_9a8 + lVar46 + 0x38) >> 0x38);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)(auStack_13d8 + 0x60),psVar37,(secp256k1_ge *)auStack_1978,
                     (secp256k1_fe *)auStack_1678);
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_13d8 + 0x60),psVar13);
          if (iVar7 == 0) goto LAB_00114a8a;
          lVar27 = lVar27 + 0x98;
          __stream = (FILE *)&__stream->_chain;
          psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
        } while (lVar27 != 0x7b8);
      }
      psVar49 = (secp256k1_context *)(auStack_13d8 + 0x60);
      psStack_1ca8 = (secp256k1_gej *)((long)(psStack_1ca8->x).n + 1);
      pFVar28 = (FILE *)&pFVar28->_chain;
    } while (psStack_1ca8 != (secp256k1_gej *)0xd);
    psVar14 = (secp256k1_gej *)auStack_9a8;
    uVar25 = 0;
    uVar11 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)psVar49,psVar14);
      uVar19 = uVar25 - 0xd;
      if (uVar11 < 7) {
        uVar19 = uVar25;
      }
      psVar39 = psVar49;
      iVar7 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar49,
                         (secp256k1_ge *)(auStack_ef8 + (ulong)uVar19 * 0x68));
      if (iVar7 == 0) goto LAB_00114b04;
      secp256k1_gej_double_var((secp256k1_gej *)psVar49,psVar14,(secp256k1_fe *)0x0);
      psVar39 = psVar49;
      iVar7 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar49,
                         (secp256k1_ge *)(auStack_ef8 + (ulong)uVar19 * 0x68));
      if (iVar7 == 0) goto LAB_00114b09;
      uVar11 = uVar11 + 1;
      uVar25 = uVar25 + 2;
      psVar14 = psVar14 + 1;
    } while (uVar11 != 0xd);
    lVar46 = 0x68;
    psVar13 = &sStack_a18;
    psVar14 = (secp256k1_gej *)(auStack_9a8 + 0x98);
    do {
      psVar39 = (secp256k1_context *)auStack_1978;
      secp256k1_ge_neg((secp256k1_ge *)psVar39,(secp256k1_ge *)(auStack_ef8 + lVar46));
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar39,psVar13);
      if (iVar7 == 0) goto LAB_00114b0e;
      secp256k1_gej_neg((secp256k1_gej *)psVar49,psVar14);
      psVar39 = psVar49;
      iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar49,psVar13);
      if (iVar7 == 0) goto LAB_00114b13;
      lVar46 = lVar46 + 0x68;
      psVar14 = psVar14 + 1;
      psVar13 = psVar13 + -1;
    } while (lVar46 != 0x548);
    lVar46 = 1;
    psStack_1c98 = (secp256k1_scalar *)0x68;
    uStack_1c90 = 0;
    do {
      psStack_1cb0 = (secp256k1_gej *)0x0;
      pFVar28 = (FILE *)auStack_ef8;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1c90 = uStack_1c90 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1c90 >> 0x20 ^ uStack_1c90 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          uVar25 = 0;
          __stream = pFVar28;
          psVar14 = psStack_1cb0;
          do {
            auStack_1bf8._0_4_ = uVar25;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
            auStack_1c28._0_4_ = (int)psStack_1cb0;
            secp256k1_scalar_verify((secp256k1_scalar *)psStack_1cb0);
            auStack_1c68._8_8_ = auStack_1978;
            auStack_1c68._0_8_ = auStack_1678;
            auStack_1c58._0_8_ = auStack_13d8 + 0x60;
            na = (code *)auStack_1bf8;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1c68,(secp256k1_gej *)auStack_1b18,1,
                       (secp256k1_gej *)(auStack_9a8 + lVar46 * 0x98),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1c28);
            iVar7 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1b18,
                               (secp256k1_ge *)(((ulong)psVar14 / 0xd) * -0x548 + (long)__stream));
            if (iVar7 == 0) {
              main_cold_57();
              goto LAB_00114a80;
            }
            uVar25 = uVar25 + 1;
            __stream = (FILE *)((long)&__stream->_flags + (long)psStack_1c98);
            psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + lVar46);
          } while (uVar25 != 0xd);
        }
        psVar49 = (secp256k1_context *)(auStack_13d8 + 0x60);
        psStack_1cb0 = (secp256k1_gej *)((long)(psStack_1cb0->x).n + 1);
        pFVar28 = (FILE *)&pFVar28->_chain;
      } while ((int)psStack_1cb0 != 0xd);
      lVar46 = lVar46 + 1;
      psStack_1c98 = (secp256k1_scalar *)((long)psStack_1c98 + 0x68);
    } while (lVar46 != 0xd);
    uVar11 = 0;
    do {
      lVar46 = 0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1c90 = uStack_1c90 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1c90 >> 0x20 ^ uStack_1c90 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          auStack_1c68._0_4_ = (int)uVar11;
          secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
          psVar13 = (secp256k1_ge *)(auStack_ef8 + lVar46 * 0x68);
          secp256k1_ecmult_const((secp256k1_gej *)psVar49,psVar13,(secp256k1_scalar *)auStack_1c68);
          uVar25 = (int)lVar46 * (int)uVar11;
          psVar40 = (secp256k1_ge *)
                    (auStack_ef8 + (ulong)(uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc)) * 0x68);
          psVar39 = psVar49;
          iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar49,psVar40);
          if (iVar7 == 0) goto LAB_00114b1d;
          if (lVar46 != 0 && uVar11 != 0) {
            psVar39 = (secp256k1_context *)auStack_1b18;
            iVar7 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1b18,(secp256k1_fe *)psVar13,
                               (secp256k1_fe *)0x0,(secp256k1_scalar *)auStack_1c68,0);
            if (iVar7 == 0) goto LAB_00114b2c;
            psVar39 = (secp256k1_context *)auStack_1b18;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)auStack_1b18,(secp256k1_fe *)psVar40);
            if (iVar7 == 0) goto LAB_00114b31;
            do {
              testutil_random_fe((secp256k1_fe *)auStack_1678);
              psVar39 = (secp256k1_context *)auStack_1678;
              secp256k1_fe_verify((secp256k1_fe *)auStack_1678);
              if (iStack_164c == 0) goto LAB_00114adc;
            } while ((SUB168(auStack_1668 | auStack_1678,8) == 0 &&
                     SUB168(auStack_1668 | auStack_1678,0) == 0) &&
                     CONCAT44(auStack_1654,auStack_1658) == 0);
            secp256k1_fe_mul((secp256k1_fe *)auStack_1978,(secp256k1_fe *)auStack_1678,
                             (secp256k1_fe *)psVar13);
            na = (code *)0x0;
            psVar39 = (secp256k1_context *)auStack_1b18;
            iVar7 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1b18,(secp256k1_fe *)auStack_1978,
                               (secp256k1_fe *)auStack_1678,(secp256k1_scalar *)auStack_1c68,0);
            if (iVar7 == 0) goto LAB_00114b36;
            psVar39 = (secp256k1_context *)auStack_1b18;
            iVar7 = secp256k1_fe_equal((secp256k1_fe *)auStack_1b18,(secp256k1_fe *)psVar40);
            if (iVar7 == 0) goto LAB_00114b3b;
          }
        }
        lVar46 = lVar46 + 1;
      } while (lVar46 != 0xd);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0xd);
    psVar39 = (secp256k1_context *)malloc(0x1020);
    if (psVar39 == (secp256k1_context *)0x0) {
      (*(psVar15->error_callback).fn)("Out of memory",(psVar15->error_callback).data);
    }
    else {
      (psVar39->ecmult_gen_ctx).ge_offset.x.n[1] = 0;
      (psVar39->ecmult_gen_ctx).built = 0x61726373;
      (psVar39->ecmult_gen_ctx).scalar_offset = 0x686374;
      (psVar39->ecmult_gen_ctx).ge_offset.x.n[0] =
           (uint64_t)((psVar39->ecmult_gen_ctx).ge_offset.x.n + 3);
      (psVar39->ecmult_gen_ctx).ge_offset.x.n[2] = 0x1000;
    }
    psStack_1bb0 = (secp256k1_context *)&psStack_1bb0->error_callback;
    p_Stack_1bc8 = (_func_void_char_ptr_void_ptr *)0x0;
    uStack_1ba0 = 0;
    psStack_1b98 = psVar39;
    do {
      p_Stack_1bb8 = (_func_void_char_ptr_void_ptr *)0x0;
      do {
        psStack_1bc0 = (secp256k1_scalar *)0x0;
        do {
          uVar42 = 0;
          psVar49 = psVar39;
          do {
            if (((ulong)num_cores == 1) ||
               (uStack_1ba0 = uStack_1ba0 + 0xe7037ed1a0b428db, psVar39 = psVar49,
               (uint32_t)
               ((uStack_1ba0 >> 0x20 ^ uStack_1ba0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
               this_core)) {
              p_Stack_1b58 = (_func_void_char_ptr_void_ptr *)(auStack_ef8 + uVar42 * 0x68);
              psStack_1b60 = (secp256k1_scalar *)(uVar42 * (long)p_Stack_1bc8 + (long)psStack_1bc0);
              uVar29 = 0;
              uStack_1b68 = uVar42;
              do {
                asStack_1378[0].ecmult_gen_ctx.built = (int)p_Stack_1bc8;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1bc8);
                asStack_1378[0].ecmult_gen_ctx.scalar_offset = (int)p_Stack_1bb8;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1bb8);
                auStack_1bf8._0_4_ = (int)psStack_1bc0;
                secp256k1_scalar_verify(psStack_1bc0);
                p_Var34 = p_Stack_1b58;
                psVar13 = &asStack_1378[0].ecmult_gen_ctx.ge_offset;
                for (lVar46 = 0xd; lVar46 != 0; lVar46 = lVar46 + -1) {
                  (psVar13->x).n[0] = *(undefined8 *)p_Var34;
                  p_Var34 = p_Var34 + (ulong)bVar55 * -0x10 + 8;
                  psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar55 * -2 + 1) * 8);
                }
                puVar36 = (uint64_t *)(auStack_ef8 + uVar29 * 0x68);
                psVar21 = &asStack_1378[0].ecmult_gen_ctx.proj_blind;
                for (pvVar22 = (void *)0xd; pvVar22 != (void *)0x0;
                    pvVar22 = (void *)((long)pvVar22 + -1)) {
                  psVar21->n[0] = *puVar36;
                  puVar36 = puVar36 + (ulong)bVar55 * -2 + 1;
                  psVar21 = (secp256k1_fe *)((long)psVar21 + ((ulong)bVar55 * -2 + 1) * 8);
                }
                secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1678);
                if (psVar49 == (secp256k1_context *)0x0) {
LAB_00113334:
                  secp256k1_ecmult_multi_simple_var
                            ((secp256k1_gej *)auStack_1678,(secp256k1_scalar *)auStack_1bf8,
                             (secp256k1_ecmult_multi_callback *)(auStack_13d8 + 0x60),pvVar22,
                             (size_t)na);
                }
                else {
                  lVar46 = 0;
                  do {
                    if (*(char *)((long)(psVar49->ecmult_gen_ctx).ge_offset.x.n + lVar46 + -8) !=
                        "scratch"[lVar46]) {
                      (*(psVar15->error_callback).fn)
                                ("invalid scratch space",(psVar15->error_callback).data);
                      uVar11 = 0;
                      goto LAB_00112f7d;
                    }
                    lVar46 = lVar46 + 1;
                  } while (lVar46 != 8);
                  uVar23 = (psVar49->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar49->ecmult_gen_ctx).ge_offset.x.n[1];
                  uVar11 = 0;
                  if (0x59 < uVar23) {
                    uVar11 = uVar23 - 0x5a;
                  }
LAB_00112f7d:
                  pvVar22 = (void *)0x1;
                  na = (code *)&DAT_00122690;
                  uVar23 = 0;
                  do {
                    if (pvVar22 == (void *)0xd) break;
                    if (pvVar22 < (void *)0xd) {
                      uVar42 = (((secp256k1_gej *)na)->x).n[0];
                    }
                    else {
                      uVar42 = 0;
                    }
                    uVar32 = (ulong)(byte)(0x7f / (byte)((byte)pvVar22 + 1));
                    uVar41 = (0x98L << ((byte)pvVar22 & 0x3f)) + uVar32 * 8 + 0x118;
                    if (uVar11 < uVar41) break;
                    uVar41 = (uVar11 - uVar41) / (uVar32 * 8 + 0x108);
                    uVar32 = uVar41;
                    if (uVar42 <= uVar41) {
                      uVar32 = uVar42;
                    }
                    if (uVar23 < uVar32) {
                      uVar23 = uVar32;
                    }
                    na = (code *)((((secp256k1_gej *)na)->x).n + 1);
                    pvVar22 = (void *)((long)pvVar22 + 1);
                  } while (uVar42 <= uVar41);
                  if (uVar23 == 0) goto LAB_00113334;
                  lVar46 = 0;
                  do {
                    cVar2 = *(char *)((long)(psVar49->ecmult_gen_ctx).ge_offset.x.n + lVar46 + -8);
                    pvVar22 = (void *)CONCAT71((int7)((ulong)pvVar22 >> 8),cVar2);
                    if (cVar2 != "scratch"[lVar46]) {
                      (*(psVar15->error_callback).fn)
                                ("invalid scratch space",(psVar15->error_callback).data);
                      goto LAB_00113334;
                    }
                    lVar46 = lVar46 + 1;
                  } while (lVar46 != 8);
                  uVar11 = (psVar49->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar49->ecmult_gen_ctx).ge_offset.x.n[1];
                  pvVar22 = (void *)0x0;
                  if (0x4a < uVar11) {
                    pvVar22 = (void *)(uVar11 - 0x4b);
                  }
                  if (pvVar22 < (void *)0x70c) goto LAB_00113334;
                  p_Stack_1b48 = (_func_void_char_ptr_void_ptr *)((long)pvVar22 - 0xe18);
                  psStack_1b38 = (secp256k1_gej *)
                                 (ulong)(p_Stack_1b48 <
                                        (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f4);
                  puStack_1b40 = (undefined1 *)((long)(psStack_1b38->x).n + 1);
                  puVar50 = (undefined1 *)0x2;
                  bVar4 = 0;
                  psStack_1c88 = (secp256k1_scalar *)auStack_1bf8;
                  lVar46 = 0;
                  uStack_1b90 = uVar29;
                  do {
                    puVar31 = puStack_1b40;
                    if (puVar50 < puStack_1b40) {
                      puVar31 = puVar50;
                    }
                    lVar46 = lVar46 << ((byte)psStack_1b38 & 0x3f);
                    lVar27 = 0;
                    psVar14 = psStack_1b38;
                    do {
                      cVar2 = *(char *)((long)(psVar49->ecmult_gen_ctx).ge_offset.x.n + lVar27 + -8)
                      ;
                      psVar14 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar14 >> 8),cVar2);
                      if (cVar2 != "scratch"[lVar27]) {
                        (*(psVar15->error_callback).fn)
                                  ("invalid scratch space",(psVar15->error_callback).data);
                        uStack_1c70 = 0;
                        psVar37 = (secp256k1_gej *)na;
                        goto LAB_001130f7;
                      }
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 8);
                    uStack_1c70 = (psVar49->ecmult_gen_ctx).ge_offset.x.n[1];
                    psVar37 = (secp256k1_gej *)na;
LAB_001130f7:
                    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1978);
                    psVar39 = psStack_1bb0;
                    na = (code *)psVar37;
                    if (puVar50 != (undefined1 *)0x0 || psStack_1c88 != (secp256k1_scalar *)0x0) {
                      psStack_1c78 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               ((secp256k1_callback *)psStack_1bb0,
                                                (secp256k1_scratch *)psVar49,(long)puVar31 * 0x98);
                      uVar18 = SUB84(psVar14,0);
                      psStack_1b50 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               ((secp256k1_callback *)psVar39,
                                                (secp256k1_scratch *)psVar49,(long)puVar31 * 4);
                      pvVar22 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar39,
                                           (secp256k1_scratch *)psVar49,(long)puVar31 * 0xc0);
                      auStack_1c68._0_8_ = pvVar22;
                      pvVar16 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar39,
                                           (secp256k1_scratch *)psVar49,(long)puVar31 * 0x1a0);
                      auStack_1c68._8_8_ = pvVar16;
                      pvVar17 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar39,
                                           (secp256k1_scratch *)psVar49,(long)puVar31 * 0x410);
                      na = (code *)psStack_1b50;
                      psVar49 = psStack_1b98;
                      auStack_1c58._0_8_ = pvVar17;
                      auVar56._0_4_ =
                           -(uint)((int)psStack_1c78 == 0 && (int)((ulong)psStack_1c78 >> 0x20) == 0
                                  );
                      auVar56._4_4_ =
                           -(uint)((int)psStack_1b50 == 0 && (int)((ulong)psStack_1b50 >> 0x20) == 0
                                  );
                      auVar56._8_4_ =
                           -(uint)((int)pvVar22 == 0 && (int)((ulong)pvVar22 >> 0x20) == 0);
                      auVar56._12_4_ =
                           -(uint)((int)pvVar16 == 0 && (int)((ulong)pvVar16 >> 0x20) == 0);
                      iVar7 = movmskps(uVar18,auVar56);
                      if ((iVar7 != 0) || (pvVar17 == (void *)0x0)) {
                        secp256k1_scratch_apply_checkpoint
                                  ((secp256k1_callback *)psStack_1bb0,
                                   (secp256k1_scratch *)psStack_1b98,uStack_1c70);
                        uVar29 = uStack_1b90;
                        na = (code *)psVar37;
                        break;
                      }
                      if (puVar50 != (undefined1 *)0x0) {
                        psVar21 = &(&asStack_1378[0].ecmult_gen_ctx.ge_offset)[lVar46].x;
                        puVar51 = (undefined1 *)0x0;
                        psVar14 = psStack_1c78;
                        do {
                          *(undefined4 *)((long)(((secp256k1_gej *)na)->x).n + (long)puVar51 * 4) =
                               *(undefined4 *)(auStack_13d8 + (long)puVar51 * 4 + lVar46 * 4 + 0x60)
                          ;
                          psVar35 = psVar21;
                          psVar13 = (secp256k1_ge *)auStack_1b18;
                          for (lVar27 = 0xd; lVar27 != 0; lVar27 = lVar27 + -1) {
                            (psVar13->x).n[0] = psVar35->n[0];
                            psVar35 = (secp256k1_fe *)((long)psVar35 + ((ulong)bVar55 * -2 + 1) * 8)
                            ;
                            psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar55 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar14,(secp256k1_ge *)auStack_1b18);
                          puVar51 = puVar51 + 1;
                          psVar14 = psVar14 + 1;
                          psVar21 = (secp256k1_fe *)((long)(psVar21 + 2) + 8);
                        } while (puVar31 != puVar51);
                      }
                      psVar14 = psStack_1c78;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1c68,
                                 (secp256k1_gej *)auStack_1978,(size_t)puVar31,psStack_1c78,
                                 (secp256k1_scalar *)na,psStack_1c88);
                      psVar49 = psStack_1b98;
                      secp256k1_scratch_apply_checkpoint
                                ((secp256k1_callback *)psStack_1bb0,
                                 (secp256k1_scratch *)psStack_1b98,uStack_1c70);
                    }
                    bVar54 = (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f3 < p_Stack_1b48;
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1678,(secp256k1_gej *)auStack_1678,
                               (secp256k1_gej *)auStack_1978,&psVar14->x);
                    puVar50 = puVar50 + -(long)puVar31;
                    bVar6 = bVar4 ^ 1;
                    lVar46 = 1;
                    psStack_1c88 = (secp256k1_scalar *)0x0;
                    bVar4 = 1;
                    uVar29 = uStack_1b90;
                  } while ((bool)(bVar54 & bVar6));
                }
                psVar39 = (secp256k1_context *)auStack_1678;
                uVar25 = (int)uVar29 * (int)p_Stack_1bb8 + (int)psStack_1b60;
                iVar7 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)psVar39,
                                   (secp256k1_ge *)
                                   (auStack_ef8 +
                                   (ulong)(uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc)) * 0x68));
                if (iVar7 == 0) goto LAB_00114b18;
                uVar29 = uVar29 + 1;
                uVar42 = uStack_1b68;
                psVar39 = psVar49;
              } while (uVar29 != 0xd);
            }
            uVar42 = uVar42 + 1;
            psVar49 = psVar39;
          } while (uVar42 != 0xd);
          psStack_1bc0 = (secp256k1_scalar *)((long)psStack_1bc0 + 1);
        } while (psStack_1bc0 != (secp256k1_scalar *)0xd);
        p_Stack_1bb8 = p_Stack_1bb8 + 1;
      } while (p_Stack_1bb8 != (_func_void_char_ptr_void_ptr *)0xd);
      p_Stack_1bc8 = p_Stack_1bc8 + 1;
    } while (p_Stack_1bc8 != (_func_void_char_ptr_void_ptr *)0xd);
    if (psVar39 != (secp256k1_context *)0x0) {
      lVar46 = 0;
      do {
        if (*(char *)((long)(psVar39->ecmult_gen_ctx).ge_offset.x.n + lVar46 + -8) !=
            "scratch"[lVar46]) {
          (*(psVar15->error_callback).fn)("invalid scratch space",(psVar15->error_callback).data);
          goto LAB_0011348c;
        }
        lVar46 = lVar46 + 1;
      } while (lVar46 != 8);
      if ((psVar39->ecmult_gen_ctx).ge_offset.x.n[1] != 0) goto LAB_00114b72;
      free(psVar39);
    }
LAB_0011348c:
    psVar47 = (secp256k1_scalar *)0x1;
    uVar11 = 0;
    do {
      r_00 = (secp256k1_scalar *)0x1;
      do {
        if (((ulong)num_cores == 1) ||
           (uVar11 = uVar11 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar11 >> 0x20 ^ uVar11 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          auStack_1b18._0_4_ = 1;
          iVar7 = 1;
          do {
            secp256k1_scalar_verify(psVar47);
            secp256k1_scalar_verify(r_00);
            secp256k1_scalar_verify(r_00);
            auStack_1978._16_8_ = 0;
            auStack_1978[0x18] = '\0';
            auStack_1978[0x19] = '\0';
            auStack_1978[0x1a] = '\0';
            auStack_1978[0x1b] = '\0';
            auStack_1978[0x1c] = '\0';
            auStack_1978[0x1d] = '\0';
            auStack_1978[0x1e] = '\0';
            auStack_1978._0_8_ = 0;
            auStack_1978[8] = '\0';
            auStack_1978[9] = '\0';
            auStack_1978[10] = '\0';
            auStack_1978[0xb] = '\0';
            auStack_1978[0xc] = '\0';
            auStack_1978[0xd] = '\0';
            auStack_1978[0xe] = '\0';
            auStack_1978[0xf] = '\0';
            auStack_1978[0x1f] = (uchar)r_00;
            secp256k1_scalar_verify(psVar47);
            auStack_1678 = (undefined1  [16])0x0;
            auStack_1668._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1668[0xf] = (char)psVar47;
            na = secp256k1_nonce_function_smallint;
            psVar39 = psVar15;
            iVar8 = secp256k1_ecdsa_sign
                              (psVar15,(secp256k1_ecdsa_signature *)(auStack_13d8 + 0x60),
                               auStack_1678,auStack_1978,secp256k1_nonce_function_smallint,
                               auStack_1b18);
            if (iVar8 != 1) goto LAB_00114b5e;
            lVar46 = 0;
            uVar25 = 0;
            do {
              uVar19 = (uint)(byte)auStack_13d8[lVar46 + 0x60] | uVar25 << 8;
              uVar25 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar25 = uVar19;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
            uVar19 = 0;
            lVar46 = 0x20;
            do {
              uVar20 = (uint)(byte)auStack_13d8[lVar46 + 0x60] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            psVar39 = (secp256k1_context *)auStack_1c68;
            r_from_k((secp256k1_scalar *)psVar39,(secp256k1_ge *)auStack_ef8,auStack_1b18._0_4_,
                     (int *)0x0);
            if (uVar25 != auStack_1c68._0_4_) goto LAB_00114b63;
            uVar18 = auStack_1b18._0_4_;
            uVar20 = auStack_1b18._0_4_ * uVar19;
            uVar25 = uVar25 * (int)r_00 + (int)psVar47;
            iVar8 = uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc);
            if ((uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) != iVar8) &&
               (uVar25 = (0xd - uVar19) * auStack_1b18._0_4_,
               uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc) != iVar8)) goto LAB_00114b68;
            if ((int)auStack_1b18._0_4_ < iVar7) break;
            iVar7 = auStack_1b18._0_4_ + 1;
            auStack_1b18._0_4_ = iVar7;
          } while ((int)uVar18 < 0xc);
        }
        uVar25 = (int)r_00 + 1;
        r_00 = (secp256k1_scalar *)(ulong)uVar25;
      } while (uVar25 != 0xd);
      uVar25 = (int)psVar47 + 1;
      psVar47 = (secp256k1_scalar *)(ulong)uVar25;
    } while (uVar25 != 0xd);
    uVar25 = 1;
    psStack_1c78 = (secp256k1_gej *)0x0;
    uVar9 = num_cores;
    do {
      psStack_1cb0 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          psStack_1ca8 = (secp256k1_gej *)0x1;
          do {
            if ((uVar9 == 1) ||
               (psStack_1c78 = (secp256k1_gej *)((long)psStack_1c78[-0x2a150f76858d35].y.n + 0x23),
               (uint32_t)
               ((ulong)uVar9 * ((ulong)psStack_1c78 >> 0x20 ^ (ulong)psStack_1c78 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1cb0 & 0xffffffff));
              auStack_1c68._0_4_ = uVar19;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1ca8 & 0xffffffff));
              uVar44 = (int)psStack_1cb0 * (int)psStack_1ca8;
              uVar44 = uVar44 - (uVar44 / 0xd + (uVar44 / 0xd) * 0xc);
              uVar11 = 0;
              uVar20 = 0;
              uVar30 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_13d8 + 0x60),(secp256k1_ge *)auStack_ef8,
                         uVar30,(int *)0x0);
                if (psStack_1cb0 ==
                    (secp256k1_gej *)(asStack_1378[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar48 = (int)uVar11 - ((int)(uVar11 / 0xd) + (int)(uVar11 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar48);
                  secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1cb0 & 0xffffffff));
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1ca8);
                  auStack_1bf8._0_4_ = uVar44;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar44);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1bf8,(secp256k1_scalar *)auStack_1bf8,
                             (secp256k1_scalar *)auStack_1c68);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar48);
                  uVar18 = auStack_1bf8._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1bf8._0_8_ & 0xffffffff));
                  uVar20 = uVar20 | uVar48 == uVar18;
                }
                uVar30 = uVar30 + 1;
                uVar11 = (ulong)((int)uVar11 + uVar25);
              } while (uVar30 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1cb0 & 0xffffffff));
              auStack_1978._16_8_ = 0;
              auStack_1978[0x18] = '\0';
              auStack_1978[0x19] = '\0';
              auStack_1978[0x1a] = '\0';
              auStack_1978[0x1b] = '\0';
              auStack_1978[0x1c] = '\0';
              auStack_1978[0x1d] = '\0';
              auStack_1978[0x1e] = '\0';
              auStack_1978._0_8_ = 0;
              auStack_1978[8] = '\0';
              auStack_1978[9] = '\0';
              auStack_1978[10] = '\0';
              auStack_1978[0xb] = '\0';
              auStack_1978[0xc] = '\0';
              auStack_1978[0xd] = '\0';
              auStack_1978[0xe] = '\0';
              auStack_1978[0xf] = '\0';
              auStack_1978[0x1f] = (uchar)psStack_1cb0;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              auStack_1978._48_8_ = 0;
              auStack_1940[0] = '\0';
              auStack_1940[1] = '\0';
              auStack_1940[2] = '\0';
              auStack_1940[3] = '\0';
              auStack_1940[4] = '\0';
              auStack_1940[5] = '\0';
              auStack_1940[6] = '\0';
              auStack_1978._32_8_ = 0;
              auStack_1978._40_7_ = 0;
              auStack_1978[0x2f] = '\0';
              auStack_1940[7] = (uchar)uVar25;
              puVar36 = (uint64_t *)(auStack_ef8 + (long)psStack_1ca8 * 0x68);
              psVar13 = (secp256k1_ge *)(auStack_13d8 + 0x60);
              for (lVar46 = 0xd; lVar46 != 0; lVar46 = lVar46 + -1) {
                (psVar13->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar55 * -2 + 1;
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar55 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1678,(secp256k1_ge *)(auStack_13d8 + 0x60));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              auStack_1b18 = (undefined1  [16])0x0;
              auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1b08[0xf] = (char)uVar19;
              psVar39 = psVar15;
              uVar30 = secp256k1_ecdsa_verify
                                 (psVar15,(secp256k1_ecdsa_signature *)auStack_1978,auStack_1b18,
                                  (secp256k1_pubkey *)auStack_1678);
              uVar9 = num_cores;
              if ((uVar25 < 7 & uVar20) != uVar30) goto LAB_00114b6d;
            }
            psStack_1ca8 = (secp256k1_gej *)((long)psStack_1ca8 + 1);
          } while (psStack_1ca8 != (secp256k1_gej *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        psStack_1cb0 = (secp256k1_gej *)((long)psStack_1cb0 + 1);
      } while (psStack_1cb0 != (secp256k1_gej *)0xd);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 0xd);
    uVar25 = 1;
    psStack_1c98 = (secp256k1_scalar *)0x0;
    do {
      psVar47 = (secp256k1_scalar *)0x1;
      do {
        iVar7 = (int)psVar47;
        if (((ulong)num_cores == 1) ||
           (psStack_1c98 = (secp256k1_scalar *)((long)psStack_1c98 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          auStack_1bf8._0_4_ = 1;
          iVar8 = 1;
          do {
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
            secp256k1_scalar_verify(psVar47);
            secp256k1_scalar_verify(psVar47);
            auStack_1b18 = (undefined1  [16])0x0;
            auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b08[0xf] = (char)psVar47;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
            auStack_1c68 = (undefined1  [16])0x0;
            auStack_1c58._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1c58[0xf] = (char)uVar25;
            na = secp256k1_nonce_function_smallint;
            secp256k1_ecdsa_sign_recoverable
                      (psVar15,(secp256k1_ecdsa_recoverable_signature *)(auStack_13d8 + 0x60),
                       auStack_1c68,auStack_1b18,secp256k1_nonce_function_smallint,auStack_1bf8);
            lVar46 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)(byte)auStack_13d8[lVar46 + 0x60] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar46 = 0x20;
            do {
              uVar30 = (uint)(byte)auStack_13d8[lVar46 + 0x60] | uVar20 << 8;
              uVar20 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
              if (uVar30 < 0xd) {
                uVar20 = uVar30;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            bVar4 = (byte)asStack_1378[0].ecmult_gen_ctx.ge_offset.y.n[1];
            psVar39 = (secp256k1_context *)auStack_1c28;
            r_from_k((secp256k1_scalar *)psVar39,(secp256k1_ge *)auStack_ef8,auStack_1bf8._0_4_,
                     (int *)&sStack_1b88);
            if (uVar19 != auStack_1c28._0_4_) goto LAB_00114b77;
            lVar46 = (long)(int)auStack_1bf8._0_4_;
            uVar30 = auStack_1bf8._0_4_ * uVar20;
            uVar19 = uVar19 * iVar7 + uVar25;
            iVar45 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar45) &&
               (uVar19 = (0xd - uVar20) * auStack_1bf8._0_4_,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar45)) goto LAB_00114b7c;
            uVar19 = (uint)((uint)sStack_1b88.fn != 0) * 2;
            lVar27 = lVar46 * 0x68;
            auStack_1658 = *(uchar (*) [4])(auStack_ea8 + lVar27);
            auStack_1654 = *(uchar (*) [4])(auStack_ea4 + lVar27);
            iStack_1650 = aiStack_ea0[lVar46 * 0x1a];
            iStack_164c = aiStack_ea0[lVar46 * 0x1a + 1];
            auStack_1678._8_8_ = auStack_ec0[lVar46 * 0xd];
            auStack_1678._0_8_ = (&uStack_ec8)[lVar46 * 0xd];
            auStack_1668._8_8_ = *(undefined8 *)(auStack_ea8 + lVar27 + -8);
            auStack_1668._0_8_ = auStack_ec0[lVar46 * 0xd + 1];
            psVar39 = (secp256k1_context *)auStack_1678;
            secp256k1_fe_normalize((secp256k1_fe *)psVar39);
            uVar20 = uVar20 * auStack_1bf8._0_4_;
            secp256k1_fe_verify((secp256k1_fe *)psVar39);
            if (uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) == iVar45) {
              if (iStack_164c == 0) goto LAB_00114b81;
              uVar19 = auStack_1678._0_4_ & 1 | uVar19;
            }
            else {
              if (iStack_164c == 0) goto LAB_00114b86;
              uVar19 = (auStack_1678._0_4_ & 1 | uVar19) ^ 1;
            }
            if (uVar19 != bVar4) goto LAB_00114b8b;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psVar15,(secp256k1_ecdsa_signature *)auStack_1978,
                       (secp256k1_ecdsa_recoverable_signature *)(auStack_13d8 + 0x60));
            lVar46 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)(byte)auStack_1978[lVar46] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar46 = 0x20;
            do {
              uVar30 = (uint)(byte)auStack_1978[lVar46] | uVar20 << 8;
              uVar20 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
              if (uVar30 < 0xd) {
                uVar20 = uVar30;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            psVar39 = (secp256k1_context *)auStack_1c28;
            r_from_k((secp256k1_scalar *)psVar39,(secp256k1_ge *)auStack_ef8,auStack_1bf8._0_4_,
                     (int *)0x0);
            if (uVar19 != auStack_1c28._0_4_) goto LAB_00114b90;
            uVar18 = auStack_1bf8._0_4_;
            uVar30 = auStack_1bf8._0_4_ * uVar20;
            uVar19 = uVar19 * iVar7 + uVar25;
            iVar45 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar45) &&
               (uVar19 = (0xd - uVar20) * auStack_1bf8._0_4_,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar45)) goto LAB_00114b95;
            if ((int)auStack_1bf8._0_4_ < iVar8) break;
            iVar8 = auStack_1bf8._0_4_ + 1;
            auStack_1bf8._0_4_ = iVar8;
          } while ((int)uVar18 < 0xc);
        }
        psVar47 = (secp256k1_scalar *)(ulong)(iVar7 + 1U);
      } while (iVar7 + 1U != 0xd);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 0xd);
    uVar25 = 1;
    psStack_1c88 = (secp256k1_scalar *)0x0;
    uVar9 = num_cores;
    do {
      psStack_1cb0 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          psStack_1c98 = (secp256k1_scalar *)0x1;
          do {
            if ((uVar9 == 1) ||
               (psStack_1c88 = (secp256k1_scalar *)((long)psStack_1c88 + 0xe7037ed1a0b428db),
               (uint32_t)
               ((ulong)uVar9 * ((ulong)psStack_1c88 >> 0x20 ^ (ulong)psStack_1c88 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1cb0 & 0xffffffff));
              auStack_1bf8._0_4_ = uVar19;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1c98 & 0xffffffff));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              auStack_1c68 = (undefined1  [16])0x0;
              auStack_1c58._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1c58[0xf] = (char)uVar19;
              uVar44 = (int)psStack_1cb0 * (int)psStack_1c98;
              uVar44 = uVar44 - (uVar44 / 0xd + (uVar44 / 0xd) * 0xc);
              uVar11 = 0;
              uVar20 = 0;
              uVar30 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_13d8 + 0x60),(secp256k1_ge *)auStack_ef8,
                         uVar30,(int *)0x0);
                if (psStack_1cb0 ==
                    (secp256k1_gej *)(asStack_1378[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar48 = (int)uVar11 - ((int)(uVar11 / 0xd) + (int)(uVar11 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar48);
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1cb0);
                  secp256k1_scalar_verify(psStack_1c98);
                  auStack_1c28._0_4_ = uVar44;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar44);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1c28,(secp256k1_scalar *)auStack_1c28,
                             (secp256k1_scalar *)auStack_1bf8);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar48);
                  uVar18 = auStack_1c28._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)auStack_1c28._0_4_);
                  uVar20 = uVar20 | uVar48 == uVar18;
                }
                uVar30 = uVar30 + 1;
                uVar11 = (ulong)((int)uVar11 + uVar25);
              } while (uVar30 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1cb0 & 0xffffffff));
              auStack_1978._16_8_ = 0;
              auStack_1978[0x18] = '\0';
              auStack_1978[0x19] = '\0';
              auStack_1978[0x1a] = '\0';
              auStack_1978[0x1b] = '\0';
              auStack_1978[0x1c] = '\0';
              auStack_1978[0x1d] = '\0';
              auStack_1978[0x1e] = '\0';
              auStack_1978._0_8_ = 0;
              auStack_1978[8] = '\0';
              auStack_1978[9] = '\0';
              auStack_1978[10] = '\0';
              auStack_1978[0xb] = '\0';
              auStack_1978[0xc] = '\0';
              auStack_1978[0xd] = '\0';
              auStack_1978[0xe] = '\0';
              auStack_1978[0xf] = '\0';
              auStack_1978[0x1f] = (uchar)psStack_1cb0;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              auStack_1978._48_8_ = 0;
              auStack_1940[0] = '\0';
              auStack_1940[1] = '\0';
              auStack_1940[2] = '\0';
              auStack_1940[3] = '\0';
              auStack_1940[4] = '\0';
              auStack_1940[5] = '\0';
              auStack_1940[6] = '\0';
              auStack_1978._32_8_ = 0;
              auStack_1978._40_7_ = 0;
              auStack_1978[0x2f] = '\0';
              auStack_1940[7] = (uchar)uVar25;
              auVar3[0xf] = 0;
              auVar3._0_15_ = auStack_1938._1_15_;
              auStack_1938 = auVar3 << 8;
              secp256k1_ecdsa_recoverable_signature_convert
                        (psVar15,(secp256k1_ecdsa_signature *)auStack_1678,
                         (secp256k1_ecdsa_recoverable_signature *)auStack_1978);
              puVar36 = (uint64_t *)(auStack_ef8 + (long)psStack_1c98 * 0x68);
              psVar13 = (secp256k1_ge *)(auStack_13d8 + 0x60);
              for (lVar46 = 0xd; lVar46 != 0; lVar46 = lVar46 + -1) {
                (psVar13->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar55 * -2 + 1;
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar55 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1b18,(secp256k1_ge *)(auStack_13d8 + 0x60));
              psVar39 = psVar15;
              uVar30 = secp256k1_ecdsa_verify
                                 (psVar15,(secp256k1_ecdsa_signature *)auStack_1678,auStack_1c68,
                                  (secp256k1_pubkey *)auStack_1b18);
              uVar9 = num_cores;
              if ((uVar25 < 7 & uVar20) != uVar30) goto LAB_00114b9a;
            }
            psStack_1c98 = (secp256k1_scalar *)((long)psStack_1c98 + 1);
          } while (psStack_1c98 != (secp256k1_scalar *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        psStack_1cb0 = (secp256k1_gej *)((long)psStack_1cb0 + 1);
      } while (psStack_1cb0 != (secp256k1_gej *)0xd);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 0xd);
    uVar11 = 1;
    puVar50 = auStack_19b8;
    puVar31 = auStack_1b18;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar11 & 0xffffffff));
      auStack_1c28 = (undefined1  [16])0x0;
      auStack_1c18._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1c18[0xf] = (char)uVar11;
      lVar46 = uVar11 - 1;
      psVar39 = psVar15;
      iVar7 = secp256k1_keypair_create
                        (psVar15,(secp256k1_keypair *)(auStack_13d8 + uVar11 * 0x60),auStack_1c28);
      if (iVar7 == 0) goto LAB_00114b9f;
      psVar39 = psVar15;
      iVar7 = secp256k1_ec_pubkey_create
                        (psVar15,(secp256k1_pubkey *)(auStack_1978 + lVar46 * 0x40),auStack_1c28);
      if (iVar7 == 0) goto LAB_00114ba4;
      psVar53 = (secp256k1_xonly_pubkey *)(auStack_1678 + lVar46 * 0x40);
      pk_parity = (uint *)(auStack_1c68 + lVar46 * 4);
      psVar39 = psVar15;
      iVar7 = secp256k1_keypair_xonly_pub
                        (psVar15,psVar53,(int *)pk_parity,
                         (secp256k1_keypair *)(auStack_13d8 + uVar11 * 0x60));
      if (iVar7 == 0) goto LAB_00114ba9;
      puVar52 = auStack_1b18 + lVar46 * 0x20;
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar15,puVar52,psVar53);
      if (iVar7 == 0) goto LAB_00114bae;
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_parse(psVar15,psVar53,puVar52);
      if (iVar7 == 0) goto LAB_00114bb3;
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar15,auStack_1c28,psVar53);
      if (iVar7 == 0) goto LAB_00114bb8;
      lVar27 = 0;
      do {
        if (puVar31[lVar27] != auStack_1c28[lVar27]) goto LAB_00114bbd;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x20);
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar15,psVar53,(int *)&sStack_1b88,
                         (secp256k1_pubkey *)(auStack_1978 + lVar46 * 0x40));
      if (iVar7 == 0) goto LAB_00114bc2;
      if ((uint)sStack_1b88.fn != *pk_parity) goto LAB_00114bc7;
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar15,auStack_1c28,psVar53);
      if (iVar7 == 0) goto LAB_00114bcc;
      lVar46 = 0;
      do {
        if (puVar31[lVar46] != auStack_1c28[lVar46]) goto LAB_00114bd1;
        lVar46 = lVar46 + 1;
      } while (lVar46 != 0x20);
      psVar39 = (secp256k1_context *)auStack_1bf8;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar39,puVar52);
      auStack_1bf8._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)psVar39);
      lVar46 = uVar11 * 0x68;
      iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar39,
                                 (secp256k1_fe *)(auStack_ef8 + uVar11 * 0x68));
      if (iVar7 == 0) goto LAB_00114bd6;
      auStack_1bf8._0_8_ = (&uStack_ec8)[uVar11 * 0xd];
      auStack_1bf8._8_8_ = auStack_ec0[uVar11 * 0xd];
      auStack_1bf8._16_8_ = auStack_ec0[uVar11 * 0xd + 1];
      auStack_1bf8._24_8_ = *(undefined8 *)(auStack_ea8 + lVar46 + -8);
      auStack_1bf8._32_4_ = *(undefined4 *)(auStack_ea8 + lVar46);
      auStack_1bf8._36_4_ = *(undefined4 *)(auStack_ea4 + lVar46);
      auStack_1bf8._44_4_ = aiStack_ea0[uVar11 * 0x1a + 1];
      auStack_1bf8._40_4_ = aiStack_ea0[uVar11 * 0x1a];
      psVar39 = (secp256k1_context *)auStack_1bf8;
      secp256k1_fe_normalize_var((secp256k1_fe *)psVar39);
      secp256k1_fe_verify((secp256k1_fe *)psVar39);
      if (auStack_1bf8._44_4_ == 0) goto LAB_00114bdb;
      if ((auStack_1bf8._0_4_ & 1) != *pk_parity) goto LAB_00114be0;
      if (6 < uVar11) {
        lVar46 = 0;
        do {
          if (puVar31[lVar46] != puVar50[lVar46]) goto LAB_00114be5;
          lVar46 = lVar46 + 1;
        } while (lVar46 != 0x20);
        if ((auStack_1bf8._0_4_ & 1) != 1U - *(int *)(auStack_1c68 + (0xc - uVar11) * 4))
        goto LAB_00114bea;
      }
      uVar11 = uVar11 + 1;
      puVar31 = puVar31 + 0x20;
      puVar50 = puVar50 + -0x20;
    } while (uVar11 != 0xd);
    lVar46 = 0;
    do {
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_parse
                        (psVar15,(secp256k1_xonly_pubkey *)(auStack_13d8 + 0x60),
                         invalid_pubkey_bytes[0] + lVar46);
      if (iVar7 != 0) goto LAB_00114bef;
      lVar46 = lVar46 + 0x20;
    } while (lVar46 != 0xe0);
    uVar25 = 1;
    puVar5 = auStack_13d8;
    psVar53 = (secp256k1_xonly_pubkey *)auStack_1978;
    puVar52 = auStack_1678;
    lVar46 = 0;
    do {
      keypair = (secp256k1_keypair *)(puVar5 + 0x60);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
      auStack_1b18 = (undefined1  [16])0x0;
      auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1b08[0xf] = (char)uVar25;
      psVar39 = psVar15;
      iVar7 = secp256k1_keypair_create(psVar15,keypair,auStack_1b18);
      if (iVar7 == 0) goto LAB_00114bf4;
      psVar39 = psVar15;
      iVar7 = secp256k1_keypair_xonly_pub(psVar15,psVar53,(int *)(auStack_1bf8 + lVar46),keypair);
      if (iVar7 == 0) goto LAB_00114bf9;
      psVar39 = psVar15;
      iVar7 = secp256k1_xonly_pubkey_serialize(psVar15,puVar52,psVar53);
      if (iVar7 == 0) goto LAB_00114bfe;
      lVar46 = lVar46 + 4;
      puVar52 = puVar52 + 0x20;
      psVar53 = psVar53 + 1;
      puVar5 = keypair->data;
      uVar25 = uVar25 + 1;
    } while (lVar46 != 0x30);
    sStack_1b30.magic[0] = 0xda;
    sStack_1b30.magic[1] = 'o';
    sStack_1b30.magic[2] = 0xb3;
    sStack_1b30.magic[3] = 0x8c;
    sStack_1b30._4_4_ = 0;
    psStack_1ca8 = (secp256k1_gej *)0x1;
    psStack_1c98 = (secp256k1_scalar *)0x0;
    do {
      iVar7 = 0xd - (int)psStack_1ca8;
      if ((&iStack_1bfc)[(long)psStack_1ca8] == 0) {
        iVar7 = (int)psStack_1ca8;
      }
      iStack_1c7c = 1;
      do {
        auStack_1c48 = (undefined1  [16])0x0;
        auStack_1c58 = (undefined1  [16])0x0;
        auStack_1c68 = (undefined1  [16])0x0;
        iStack_1c38 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1c98 = (secp256k1_scalar *)((long)psStack_1c98 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          sStack_1b30.noncefp = secp256k1_hardened_nonce_function_smallint;
          sStack_1b30.ndata = &iStack_1c7c;
          iVar8 = 0xd - iStack_1c7c;
          if ((&iStack_1bfc)[iStack_1c7c] == 0) {
            iVar8 = iStack_1c7c;
          }
          iVar45 = 0;
          do {
            testrand256(auStack_1c28);
            na = (code *)(auStack_1678 + ((long)psStack_1ca8 + -1) * 0x20);
            secp256k1_schnorrsig_challenge
                      (&uStack_1ba4,auStack_1698 + (long)iStack_1c7c * 0x20,auStack_1c28,0x20,
                       (uchar *)(auStack_1678 + ((long)psStack_1ca8 + -1) * 0x20));
            uVar11 = (ulong)uStack_1ba4;
            if (*(int *)(auStack_1c68 + uVar11 * 4) == 0) {
              uVar25 = uStack_1ba4 * iVar7 + iVar8;
              uVar25 = uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
              sStack_1b88.fn = (_func_void_char_ptr_void_ptr *)0x0;
              sStack_1b88.data = (void *)0x0;
              sStack_1b78._0_15_ = SUB1615((undefined1  [16])0x0,0);
              sStack_1b78.data._7_1_ = (char)uVar25;
              psVar39 = psVar15;
              na = (code *)(auStack_13d8 + (long)psStack_1ca8 * 0x60);
              iVar10 = secp256k1_schnorrsig_sign_custom
                                 (psVar15,auStack_1b18,auStack_1c28,0x20,
                                  (secp256k1_keypair *)(auStack_13d8 + (long)psStack_1ca8 * 0x60),
                                  &sStack_1b30);
              if (iVar10 == 0) goto LAB_00114c03;
              lVar46 = 0;
              do {
                if (auStack_1b18[lVar46] != auStack_1698[lVar46 + (long)iStack_1c7c * 0x20])
                goto LAB_00114c08;
                lVar46 = lVar46 + 1;
              } while (lVar46 != 0x20);
              lVar46 = 0;
              do {
                if (auStack_1af8[lVar46] != *(char *)((long)&sStack_1b88.fn + lVar46))
                goto LAB_00114c0d;
                lVar46 = lVar46 + 1;
              } while (lVar46 != 0x20);
              *(undefined4 *)(auStack_1c68 + uVar11 * 4) = 1;
              iVar45 = iVar45 + 1;
            }
          } while (iVar45 < 0xd);
        }
        iVar8 = iStack_1c7c + 1;
        bVar54 = iStack_1c7c < 0xc;
        iStack_1c7c = iVar8;
      } while (bVar54);
      psStack_1ca8 = (secp256k1_gej *)((long)psStack_1ca8 + 1);
    } while (psStack_1ca8 != (secp256k1_gej *)0xd);
    psStack_1ca8 = (secp256k1_gej *)0x1;
    psStack_1c98 = (secp256k1_scalar *)0x0;
    do {
      lVar46 = ((long)psStack_1ca8 + -1) * 0x20;
      auStack_1c18 = *(undefined1 (*) [16])(auStack_1668 + lVar46);
      iVar7 = 0xd - (int)psStack_1ca8;
      if ((&iStack_1bfc)[(long)psStack_1ca8] == 0) {
        iVar7 = (int)psStack_1ca8;
      }
      psStack_1c78 = (secp256k1_gej *)CONCAT44(psStack_1c78._4_4_,iVar7);
      auStack_1c28._8_8_ = *(undefined8 *)(auStack_1678 + lVar46 + 8);
      auStack_1c28._0_8_ = *(undefined8 *)(auStack_1678 + lVar46);
      psStack_1cb0 = (secp256k1_gej *)(auStack_1978 + ((long)psStack_1ca8 + -1) * 0x40);
      uVar11 = 1;
      do {
        auStack_1c48 = (undefined1  [16])0x0;
        auStack_1c58 = (undefined1  [16])0x0;
        auStack_1c68 = (undefined1  [16])0x0;
        iStack_1c38 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1c98 = (secp256k1_scalar *)((long)psStack_1c98 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          if (uVar11 < 7) {
            lVar46 = (uVar11 - 1) * 0x20;
            auStack_1b08 = *(undefined1 (*) [16])(auStack_1668 + lVar46);
            auStack_1b18._8_8_ = *(undefined8 *)(auStack_1678 + lVar46 + 8);
            auStack_1b18._0_8_ = *(undefined8 *)(auStack_1678 + lVar46);
            iVar7 = 0xd - (int)uVar11;
            if ((&iStack_1bfc)[uVar11] == 0) {
              iVar7 = (int)uVar11;
            }
          }
          else {
            auStack_1b18 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar11 * 4 + 2);
            auStack_1b08 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar11 * 4 + 4);
            iVar7 = -1;
          }
          uStack_1c70 = CONCAT44(uStack_1c70._4_4_,(uint)(iVar7 != -1));
          iVar8 = 0;
          do {
            testrand256((uchar *)&sStack_1b88);
            na = (code *)auStack_1c28;
            secp256k1_schnorrsig_challenge
                      ((secp256k1_scalar *)&sStack_1b30,auStack_1b18,(uchar *)&sStack_1b88,0x20,
                       (uchar *)na);
            uVar23 = sStack_1b30._0_8_ & 0xffffffff;
            if (*(int *)(auStack_1c68 + uVar23 * 4) == 0) {
              uVar25 = sStack_1b30.magic * (int)psStack_1c78 + iVar7;
              iVar10 = 0;
              iVar45 = 0;
              do {
                if (iVar10 == 0xe) {
                  testrand256(auStack_1af8);
                  uVar19 = 0;
                }
                else {
                  auStack_1af8 = (undefined1  [16])0x0;
                  auStack_1ae8._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1ae8[0xf] = (char)iVar10;
                  uVar19 = 0;
                  if (iVar10 != 0xd && iVar7 != -1) {
                    uVar19 = (uint)(uVar25 - (uVar25 / 0xd + (uVar25 / 0xd) * 0xc) == iVar10);
                  }
                }
                psVar39 = psVar15;
                na = (code *)psStack_1cb0;
                uVar20 = secp256k1_schnorrsig_verify
                                   (psVar15,auStack_1b18,(uchar *)&sStack_1b88,0x20,
                                    (secp256k1_xonly_pubkey *)psStack_1cb0);
                if (uVar20 != uVar19) goto LAB_00114c12;
                iVar45 = iVar45 + uVar19;
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0xf);
              if (iVar45 != (int)uStack_1c70) goto LAB_00114c17;
              *(undefined4 *)(auStack_1c68 + uVar23 * 4) = 1;
              iVar8 = iVar8 + 1;
            }
          } while (iVar8 < 0xd);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xe);
      psStack_1ca8 = (secp256k1_gej *)((long)psStack_1ca8 + 1);
    } while (psStack_1ca8 != (secp256k1_gej *)0x7);
    lVar46 = 0x68;
    uVar25 = 1;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar25);
      auStack_1b18 = (undefined1  [16])0x0;
      auStack_1b08._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1b08[0xf] = (char)uVar25;
      psVar39 = psVar15;
      iVar7 = secp256k1_ellswift_create(psVar15,auStack_1978,auStack_1b18,(uchar *)0x0);
      if (iVar7 == 0) goto LAB_00114c1c;
      secp256k1_ellswift_decode(psVar15,(secp256k1_pubkey *)auStack_1678,auStack_1978);
      psVar39 = (secp256k1_context *)(auStack_13d8 + 0x60);
      secp256k1_pubkey_load(psVar15,(secp256k1_ge *)psVar39,(secp256k1_pubkey *)auStack_1678);
      iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar39,(secp256k1_ge *)(auStack_ef8 + lVar46));
      if (iVar7 == 0) goto LAB_00114c21;
      lVar46 = lVar46 + 0x68;
      uVar25 = uVar25 + 1;
    } while (lVar46 != 0x548);
    secp256k1_context_destroy(psVar15);
    iVar7 = count;
  }
LAB_00114b40:
  main_cold_70();
LAB_00114b45:
  main_cold_66();
LAB_00114b4a:
  main_cold_65();
LAB_00114b4f:
  main_cold_74();
LAB_00114b54:
  main_cold_73();
LAB_00114b59:
  main_cold_72();
LAB_00114b5e:
  main_cold_11();
LAB_00114b63:
  main_cold_12();
LAB_00114b68:
  main_cold_13();
LAB_00114b6d:
  main_cold_14();
LAB_00114b72:
  main_cold_10();
LAB_00114b77:
  main_cold_15();
LAB_00114b7c:
  main_cold_16();
LAB_00114b81:
  main_cold_49();
LAB_00114b86:
  main_cold_17();
LAB_00114b8b:
  main_cold_18();
LAB_00114b90:
  main_cold_19();
LAB_00114b95:
  main_cold_20();
LAB_00114b9a:
  main_cold_21();
LAB_00114b9f:
  main_cold_48();
LAB_00114ba4:
  main_cold_47();
LAB_00114ba9:
  main_cold_46();
LAB_00114bae:
  main_cold_45();
LAB_00114bb3:
  main_cold_44();
LAB_00114bb8:
  main_cold_43();
LAB_00114bbd:
  main_cold_22();
LAB_00114bc2:
  main_cold_42();
LAB_00114bc7:
  main_cold_23();
LAB_00114bcc:
  main_cold_41();
LAB_00114bd1:
  main_cold_24();
LAB_00114bd6:
  main_cold_40();
LAB_00114bdb:
  main_cold_39();
LAB_00114be0:
  main_cold_25();
LAB_00114be5:
  main_cold_26();
LAB_00114bea:
  main_cold_27();
LAB_00114bef:
  main_cold_28();
LAB_00114bf4:
  main_cold_38();
LAB_00114bf9:
  main_cold_37();
LAB_00114bfe:
  main_cold_36();
LAB_00114c03:
  main_cold_35();
LAB_00114c08:
  main_cold_29();
LAB_00114c0d:
  main_cold_30();
LAB_00114c12:
  main_cold_31();
LAB_00114c17:
  main_cold_32();
LAB_00114c1c:
  main_cold_34();
LAB_00114c21:
  main_cold_33();
  lVar46 = 0;
  do {
    uVar42 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar32 = secp256k1_test_state[1] << 0x11;
    uVar23 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar11 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar23;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar11;
    secp256k1_test_state[3] = uVar11 << 0x2d | uVar11 >> 0x13;
    secp256k1_test_state[2] = uVar23 ^ uVar32;
    (psVar39->ecmult_gen_ctx).ge_offset.x.n[lVar46 + -1] = uVar42;
    lVar46 = lVar46 + 1;
  } while ((int)lVar46 != 4);
  return (int)secp256k1_test_state[0];
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}